

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O0

void __thiscall hwnet::TCPSocket::checkTimeout(TCPSocket *this,Ptr *t)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  element_type *this_00;
  enable_shared_from_this<hwnet::TCPSocket> local_b8;
  undefined1 local_a8 [8];
  RecvTimeoutCallback cb_1;
  duration<long,_std::ratio<1L,_1000000000L>_> local_80;
  enable_shared_from_this<hwnet::TCPSocket> local_78 [2];
  undefined1 local_58 [8];
  SendTimeoutCallback cb;
  duration<long,_std::ratio<1L,_1000000000L>_> local_30;
  shared_ptr<hwnet::util::Timer> local_28;
  Ptr *local_18;
  Ptr *t_local;
  TCPSocket *this_local;
  
  local_18 = t;
  t_local = (Ptr *)this;
  std::weak_ptr<hwnet::util::Timer>::lock((weak_ptr<hwnet::util::Timer> *)&local_28);
  bVar1 = std::operator!=(t,&local_28);
  std::shared_ptr<hwnet::util::Timer>::~shared_ptr(&local_28);
  if (!bVar1) {
    bVar2 = std::atomic::operator_cast_to_bool((atomic *)&this->closed);
    bVar1 = false;
    if ((!bVar2) && (bVar1 = false, this->sendTimeout != 0)) {
      bVar2 = std::function::operator_cast_to_bool((function *)&this->sendTimeoutCallback_);
      bVar1 = false;
      if (bVar2) {
        bVar2 = linklist::empty(this->ptrSendlist);
        bVar1 = false;
        if (!bVar2) {
          cb._M_invoker = (_Invoker_type)std::chrono::_V2::steady_clock::now();
          local_30.__r = (rep)std::chrono::operator-
                                        ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                          *)&cb._M_invoker,&this->lastSendTime);
          uVar3 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_30);
          bVar1 = this->sendTimeout * 1000000 < uVar3;
        }
      }
    }
    if (bVar1) {
      std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)>::function
                ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)> *)local_58,
                 &this->sendTimeoutCallback_);
      this->sendTimeout = 0;
      std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)>::operator=
                (&this->sendTimeoutCallback_,(nullptr_t)0x0);
      std::mutex::unlock(&this->mtx);
      std::enable_shared_from_this<hwnet::TCPSocket>::shared_from_this(local_78);
      std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)>::operator()
                ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)> *)local_58,
                 (shared_ptr<hwnet::TCPSocket> *)local_78);
      std::shared_ptr<hwnet::TCPSocket>::~shared_ptr((shared_ptr<hwnet::TCPSocket> *)local_78);
      std::mutex::lock(&this->mtx);
      std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)>::~function
                ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)> *)local_58);
    }
    bVar2 = std::atomic::operator_cast_to_bool((atomic *)&this->closed);
    bVar1 = false;
    if ((!bVar2) && (bVar1 = false, this->recvTimeout != 0)) {
      bVar2 = std::function::operator_cast_to_bool((function *)&this->recvTimeoutCallback_);
      bVar1 = false;
      if (bVar2) {
        bVar2 = recvListEmpty(this);
        bVar1 = false;
        if (!bVar2) {
          cb_1._M_invoker = (_Invoker_type)std::chrono::_V2::steady_clock::now();
          local_80.__r = (rep)std::chrono::operator-
                                        ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                          *)&cb_1._M_invoker,&this->lastRecvTime);
          uVar3 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_80);
          bVar1 = this->recvTimeout * 1000000 < uVar3;
        }
      }
    }
    if (bVar1) {
      std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)>::function
                ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)> *)local_a8,
                 &this->recvTimeoutCallback_);
      this->recvTimeout = 0;
      std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)>::operator=
                (&this->recvTimeoutCallback_,(nullptr_t)0x0);
      std::mutex::unlock(&this->mtx);
      std::enable_shared_from_this<hwnet::TCPSocket>::shared_from_this(&local_b8);
      std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)>::operator()
                ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)> *)local_a8,
                 (shared_ptr<hwnet::TCPSocket> *)&local_b8);
      std::shared_ptr<hwnet::TCPSocket>::~shared_ptr((shared_ptr<hwnet::TCPSocket> *)&local_b8);
      std::mutex::lock(&this->mtx);
      std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)>::~function
                ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)> *)local_a8);
    }
    if ((this->sendTimeout == 0) && (this->recvTimeout == 0)) {
      this_00 = std::
                __shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)t);
      util::Timer::cancel(this_00);
      std::__weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>::reset
                (&(this->timer).super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>);
    }
  }
  return;
}

Assistant:

void TCPSocket::checkTimeout(hwnet::util::Timer::Ptr t) {

	if(t != this->timer.lock()) {
		return;
	}
		
	if(!this->closed && this->sendTimeout > 0 && 
	   this->sendTimeoutCallback_ && !this->ptrSendlist->empty() &&
	   (util::milliseconds)((std::chrono::steady_clock::now() - this->lastSendTime).count()) > this->sendTimeout*1000000) {
		SendTimeoutCallback cb = this->sendTimeoutCallback_;

		this->sendTimeout = 0;
		this->sendTimeoutCallback_ = nullptr;

		this->mtx.unlock();
		cb(shared_from_this());
		this->mtx.lock();
	}

	if(!this->closed && this->recvTimeout > 0 && 
	   this->recvTimeoutCallback_ && !this->recvListEmpty() &&
	   (util::milliseconds)((std::chrono::steady_clock::now() - this->lastRecvTime).count()) > this->recvTimeout*1000000) {
		RecvTimeoutCallback cb = this->recvTimeoutCallback_;
		
		this->recvTimeout = 0;
		this->recvTimeoutCallback_ = nullptr;

		this->mtx.unlock();
		cb(shared_from_this());
		this->mtx.lock();
	}

	if(this->sendTimeout == 0 && this->recvTimeout == 0) {
		t->cancel();
		this->timer.reset();
	}

}